

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void boost::detail::add_new_tss_node
               (void *key,shared_ptr<boost::detail::tss_cleanup_function> *func,void *tss_data)

{
  tss_data_node *in_RSI;
  thread_data_base *current_thread_data;
  shared_ptr<boost::detail::tss_cleanup_function> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  pair<const_void_*,_boost::detail::tss_data_node> *in_stack_ffffffffffffff58;
  
  get_or_make_current_thread_data();
  shared_ptr<boost::detail::tss_cleanup_function>::shared_ptr
            ((shared_ptr<boost::detail::tss_cleanup_function> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  tss_data_node::tss_data_node
            (in_RSI,(shared_ptr<boost::detail::tss_cleanup_function> *)in_stack_ffffffffffffff58,
             (void *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  std::make_pair<void_const*&,boost::detail::tss_data_node>
            (&in_stack_ffffffffffffff58->first,
             (tss_data_node *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  std::
  map<void_const*,boost::detail::tss_data_node,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
  ::insert<std::pair<void_const*,boost::detail::tss_data_node>>
            ((map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
              *)in_RSI,in_stack_ffffffffffffff58);
  std::pair<const_void_*,_boost::detail::tss_data_node>::~pair
            ((pair<const_void_*,_boost::detail::tss_data_node> *)0x2a48b0);
  tss_data_node::~tss_data_node((tss_data_node *)0x2a48ba);
  shared_ptr<boost::detail::tss_cleanup_function>::~shared_ptr
            ((shared_ptr<boost::detail::tss_cleanup_function> *)0x2a48c4);
  return;
}

Assistant:

void add_new_tss_node(void const* key,
                              boost::shared_ptr<tss_cleanup_function> func,
                              void* tss_data)
        {
            detail::thread_data_base* const current_thread_data(get_or_make_current_thread_data());
            current_thread_data->tss_data.insert(std::make_pair(key,tss_data_node(func,tss_data)));
        }